

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O1

void __thiscall zmq::plain_server_t::process_handshake_command(plain_server_t *this)

{
  msg_t *in_RSI;
  
  process_handshake_command
            ((plain_server_t *)
             ((long)&(this->super_zap_client_common_handshake_t).super_zap_client_t.
                     _vptr_zap_client_t +
             (long)(this->super_zap_client_common_handshake_t).super_zap_client_t._vptr_zap_client_t
                   [-5]),in_RSI);
  return;
}

Assistant:

int zmq::plain_server_t::process_handshake_command (msg_t *msg_)
{
    int rc = 0;

    switch (state) {
        case waiting_for_hello:
            rc = process_hello (msg_);
            break;
        case waiting_for_initiate:
            rc = process_initiate (msg_);
            break;
        default:
            //  TODO see comment in curve_server_t::process_handshake_command
            session->get_socket ()->event_handshake_failed_protocol (
              session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNSPECIFIED);
            errno = EPROTO;
            rc = -1;
            break;
    }
    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}